

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

set<double,_std::less<double>,_std::allocator<double>_> * __thiscall
CMU462::DynamicScene::Skeleton::load
          (set<double,_std::less<double>,_std::allocator<double>_> *__return_storage_ptr__,
          Skeleton *this,char *filename)

{
  XMLError XVar1;
  ostream *poVar2;
  XMLNode *this_00;
  XMLElement *jointNode;
  Joint *pJVar3;
  XMLElement *pElement;
  XMLNode *pRoot;
  undefined1 local_2b8 [4];
  XMLError eResult;
  XMLDocument xmlDoc;
  char *filename_local;
  Skeleton *this_local;
  set<double,_std::less<double>,_std::allocator<double>_> *knotTimes;
  
  std::set<double,_std::less<double>,_std::allocator<double>_>::set(__return_storage_ptr__);
  poVar2 = std::operator<<((ostream *)&std::cerr,"Loading skeleton from file ");
  poVar2 = std::operator<<(poVar2,filename);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  tinyxml2::XMLDocument::XMLDocument((XMLDocument *)local_2b8,true,PRESERVE_WHITESPACE);
  XVar1 = tinyxml2::XMLDocument::LoadFile((XMLDocument *)local_2b8,filename);
  if (XVar1 != XML_NO_ERROR) {
    printf("Error: %i\n",(ulong)XVar1);
  }
  this_00 = tinyxml2::XMLNode::FirstChild((XMLNode *)local_2b8);
  if (this_00 == (XMLNode *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Skeleton file is not a valid XML file.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    jointNode = tinyxml2::XMLNode::FirstChildElement(this_00,"Joint");
    if (jointNode == (XMLElement *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Root joint does not exist.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
      clear(&this->joints);
      pJVar3 = loadJoint(this,jointNode,__return_storage_ptr__);
      this->root = pJVar3;
      this->root->parent = (Joint *)0x0;
    }
  }
  tinyxml2::XMLDocument::~XMLDocument((XMLDocument *)local_2b8);
  return __return_storage_ptr__;
}

Assistant:

set<double> Skeleton::load(const char * filename)
   {
     set<double> knotTimes;
     cerr << "Loading skeleton from file " << filename << endl;
     XMLDocument xmlDoc;
     XMLError eResult = xmlDoc.LoadFile(filename);
     XMLCheckResult(eResult);

     XMLNode* pRoot = xmlDoc.FirstChild();
     if (pRoot == nullptr)
     {
       cout << "Skeleton file is not a valid XML file." << endl;
       return knotTimes;
     }

     XMLElement * pElement = pRoot->FirstChildElement("Joint");
     if (pElement == nullptr)
     {
       cout << "Root joint does not exist." << endl;
       return knotTimes;
     }

     // clear skeleton and create a new one
     joints.clear();
     root = loadJoint(pElement, knotTimes);
     root->parent = nullptr;

     return knotTimes;
   }